

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtypedh.cpp
# Opt level: O0

void vmb_put_dh(char *buf,vm_val_t *val)

{
  undefined4 *in_RSI;
  undefined1 *in_RDI;
  
  *in_RDI = *(undefined1 *)in_RSI;
  switch(*in_RSI) {
  case 5:
  case 0x11:
    oswp4(in_RDI + 1,(ulong)(uint)in_RSI[2]);
    break;
  case 6:
    oswp2(in_RDI + 1,(uint)*(ushort *)(in_RSI + 2));
    break;
  case 7:
    oswp4(in_RDI + 1,(long)(int)in_RSI[2]);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    oswp4(in_RDI + 1,(ulong)(uint)in_RSI[2]);
    break;
  default:
    break;
  case 0xf:
    oswp4(in_RDI + 1,(ulong)(uint)in_RSI[2]);
    break;
  case 0x10:
  case 0x12:
    oswp2(in_RDI + 1,(uint)*(ushort *)((long)in_RSI + 10));
    oswp2(in_RDI + 3,(uint)*(ushort *)(in_RSI + 2));
  }
  return;
}

Assistant:

void vmb_put_dh(char *buf, const vm_val_t *val)
{
    /* store the type code */
    buf[0] = (char)val->typ;

    /* store the value, in the appropriate type-dependent format */
    switch(val->typ)
    {
    case VM_OBJ:
    case VM_OBJX:
        /* store the object ID as a UINT4 */
        oswp4(buf+1, val->val.obj);
        break;

    case VM_PROP:
        /* store the property ID as a UINT2 */
        oswp2(buf+1, val->val.prop);
        break;

    case VM_INT:
        oswp4(buf+1, val->val.intval);
        break;

    case VM_BIFPTR:
    case VM_BIFPTRX:
        /* store the integer as two UINT2s: function index, set index */
        oswp2(buf+1, val->val.bifptr.func_idx);
        oswp2(buf+3, val->val.bifptr.set_idx);
        break;

    case VM_ENUM:
        /* store the enumerated constant value as a UINT4 */
        oswp4(buf+1, val->val.enumval);
        break;

    case VM_SSTRING:
    case VM_DSTRING:
    case VM_LIST:
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* store the offset value as a UINT4 */
        oswp4(buf+1, val->val.ofs);
        break;

    default:
        /* other types have no extra data or cannot be put into a DH */
        break;
    }
}